

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3d.h
# Opt level: O1

m3dtr_t * m3d_frame(m3d_t *model,M3D_INDEX actionid,M3D_INDEX frameid,m3dtr_t *skeleton)

{
  m3dfr_t *pmVar1;
  uint uVar2;
  ulong uVar3;
  M3D_INDEX *pMVar4;
  long lVar5;
  ulong uVar6;
  
  if ((((model == (m3d_t *)0x0) || ((ulong)model->numbone == 0)) || (model->bone == (m3db_t *)0x0))
     || ((actionid != 0xffffffff &&
         (((model->action == (m3da_t *)0x0 || (model->numaction <= actionid)) ||
          (model->action[actionid].numframe <= frameid)))))) {
    model->errcode = -0x45;
    return skeleton;
  }
  model->errcode = '\0';
  if (skeleton == (m3dtr_t *)0x0) {
    skeleton = (m3dtr_t *)malloc((ulong)model->numbone * 0xc);
    if (skeleton == (m3dtr_t *)0x0) {
      model->errcode = -1;
      return (m3dtr_t *)0x0;
    }
  }
  else {
    uVar3 = (ulong)frameid;
    if (actionid != 0xffffffff && frameid != 0) goto LAB_0046d474;
  }
  if (model->numbone == 0) {
    uVar3 = 0;
  }
  else {
    pMVar4 = &skeleton->ori;
    uVar3 = 0;
    lVar5 = 0;
    uVar6 = 0;
    do {
      ((m3dtr_t *)(pMVar4 + -2))->boneid = (M3D_INDEX)uVar6;
      pMVar4[-1] = *(M3D_INDEX *)((long)model->bone->mat4 + lVar5 + -0x18);
      *pMVar4 = *(M3D_INDEX *)((long)model->bone->mat4 + lVar5 + -0x14);
      uVar6 = uVar6 + 1;
      pMVar4 = pMVar4 + 3;
      lVar5 = lVar5 + 0x68;
    } while (uVar6 < model->numbone);
  }
LAB_0046d474:
  if ((actionid < model->numaction) &&
     ((frameid != 0 || ((model->action[actionid].frame)->msec == 0)))) {
    do {
      pmVar1 = model->action[actionid].frame;
      if (pmVar1[uVar3].numtransform != 0) {
        lVar5 = 0;
        uVar6 = 0;
        do {
          skeleton[*(uint *)((long)&(pmVar1[uVar3].transform)->boneid + lVar5)].pos =
               *(M3D_INDEX *)((long)&(pmVar1[uVar3].transform)->pos + lVar5);
          skeleton[*(uint *)((long)&(pmVar1[uVar3].transform)->boneid + lVar5)].ori =
               *(M3D_INDEX *)((long)&(pmVar1[uVar3].transform)->ori + lVar5);
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0xc;
        } while (uVar6 < pmVar1[uVar3].numtransform);
      }
      uVar2 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar2;
    } while (uVar2 <= frameid);
  }
  return skeleton;
}

Assistant:

m3dtr_t *m3d_frame(m3d_t *model, M3D_INDEX actionid, M3D_INDEX frameid, m3dtr_t *skeleton)
{
    unsigned int i;
    M3D_INDEX s = frameid;
    m3dfr_t *fr;

    if(!model || !model->numbone || !model->bone || (actionid != M3D_UNDEF && (!model->action ||
        actionid >= model->numaction || frameid >= model->action[actionid].numframe))) {
            model->errcode = M3D_ERR_UNKFRAME;
            return skeleton;
    }
    model->errcode = M3D_SUCCESS;
    if(!skeleton) {
        skeleton = (m3dtr_t*)M3D_MALLOC(model->numbone * sizeof(m3dtr_t));
        if(!skeleton) {
            model->errcode = M3D_ERR_ALLOC;
            return NULL;
        }
        goto gen;
    }
    if(actionid == M3D_UNDEF || !frameid) {
gen:    s = 0;
        for(i = 0; i < model->numbone; i++) {
            skeleton[i].boneid = i;
            skeleton[i].pos = model->bone[i].pos;
            skeleton[i].ori = model->bone[i].ori;
        }
    }
    if(actionid < model->numaction && (frameid || !model->action[actionid].frame[0].msec)) {
        for(; s <= frameid; s++) {
            fr = &model->action[actionid].frame[s];
            for(i = 0; i < fr->numtransform; i++) {
                skeleton[fr->transform[i].boneid].pos = fr->transform[i].pos;
                skeleton[fr->transform[i].boneid].ori = fr->transform[i].ori;
            }
        }
    }
    return skeleton;
}